

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::PoolingLayerParams::clear_PoolingPaddingType(PoolingLayerParams *this)

{
  PoolingPaddingTypeCase PVar1;
  PoolingLayerParams *this_local;
  
  PVar1 = PoolingPaddingType_case(this);
  switch(PVar1) {
  case POOLINGPADDINGTYPE_NOT_SET:
    break;
  case kValid:
    if ((this->PoolingPaddingType_).valid_ != (ValidPadding *)0x0) {
      (*(((this->PoolingPaddingType_).valid_)->super_MessageLite)._vptr_MessageLite[1])();
    }
    break;
  case kSame:
    if ((this->PoolingPaddingType_).valid_ != (ValidPadding *)0x0) {
      (*(((this->PoolingPaddingType_).valid_)->super_MessageLite)._vptr_MessageLite[1])();
    }
    break;
  case kIncludeLastPixel:
    if ((this->PoolingPaddingType_).valid_ != (ValidPadding *)0x0) {
      (*(((this->PoolingPaddingType_).valid_)->super_MessageLite)._vptr_MessageLite[1])();
    }
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void PoolingLayerParams::clear_PoolingPaddingType() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.PoolingLayerParams)
  switch (PoolingPaddingType_case()) {
    case kValid: {
      delete PoolingPaddingType_.valid_;
      break;
    }
    case kSame: {
      delete PoolingPaddingType_.same_;
      break;
    }
    case kIncludeLastPixel: {
      delete PoolingPaddingType_.includelastpixel_;
      break;
    }
    case POOLINGPADDINGTYPE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = POOLINGPADDINGTYPE_NOT_SET;
}